

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpack_cursor.hpp
# Opt level: O3

void __thiscall
jsoncons::msgpack::basic_msgpack_cursor<jsoncons::stream_source<unsigned_char>,std::allocator<char>>
::basic_msgpack_cursor<std::istream&>
          (basic_msgpack_cursor<jsoncons::stream_source<unsigned_char>,std::allocator<char>> *this,
          basic_istream<char,_std::char_traits<char>_> *source,msgpack_decode_options *options,
          allocator<char> *alloc)

{
  char cVar1;
  
  *(undefined8 *)this = 0xb46a68;
  *(undefined8 *)(this + 0x358) = 0xb46b08;
  basic_msgpack_parser<jsoncons::stream_source<unsigned_char>,std::allocator<char>>::
  basic_msgpack_parser<std::istream&>
            ((basic_msgpack_parser<jsoncons::stream_source<unsigned_char>,std::allocator<char>> *)
             (this + 8),source,options,alloc);
  *(undefined ***)(this + 0x220) = &PTR__basic_json_visitor_00b30320;
  *(undefined2 *)(this + 0x228) = 3;
  *(undefined4 *)(this + 0x250) = 0;
  *(undefined8 *)(this + 0x230) = 0;
  *(undefined8 *)(this + 0x238) = 0;
  *(undefined8 *)(this + 0x23c) = 0;
  *(undefined8 *)(this + 0x244) = 0;
  *(undefined8 *)(this + 600) = 0;
  *(undefined8 *)(this + 0x260) = 0;
  *(undefined8 *)(this + 0x268) = 0;
  *(undefined8 *)(this + 0x270) = 0;
  *(undefined8 *)(this + 0x278) = 0;
  basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::
  basic_item_event_visitor_to_json_visitor
            ((basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_> *)(this + 0x280)
             ,(basic_json_visitor<char> *)(this + 0x220),alloc);
  this[0x350] = (basic_msgpack_cursor<jsoncons::stream_source<unsigned_char>,std::allocator<char>>)
                0x0;
  this[0x18] = (basic_msgpack_cursor<jsoncons::stream_source<unsigned_char>,std::allocator<char>>)
               0x1;
  cVar1 = (**(code **)(*(long *)this + 0x18))(this);
  if (cVar1 == '\0') {
    (**(code **)(*(long *)this + 0x38))(this);
  }
  return;
}

Assistant:

basic_msgpack_cursor(Sourceable&& source,
        const msgpack_decode_options& options = msgpack_decode_options(),
        const Allocator& alloc = Allocator())
        : parser_(std::forward<Sourceable>(source), options, alloc),
          cursor_handler_adaptor_(cursor_visitor_, alloc)
    {
        parser_.cursor_mode(true);
        if (!done())
        {
            next();
        }
    }